

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lnsrchmp.c
# Opt level: O1

int stopcheck_mt(double fx,int N,double *xc,double *xf,double *jac,double *dx,double fsval,
                double gtol,double stol,int retval)

{
  double *array;
  ulong uVar1;
  int iVar2;
  double dVar3;
  double dVar4;
  
  if (retval == 3) {
    iVar2 = 4;
  }
  else if (retval == 0xf) {
    iVar2 = 0xf;
  }
  else {
    array = (double *)malloc((long)N * 8);
    if (0 < N) {
      dVar3 = ABS(fx);
      if (ABS(fx) <= ABS(fsval)) {
        dVar3 = ABS(fsval);
      }
      uVar1 = 0;
      do {
        dVar4 = ABS(xf[uVar1]);
        if (ABS(xf[uVar1]) <= 1.0 / ABS(dx[uVar1])) {
          dVar4 = 1.0 / ABS(dx[uVar1]);
        }
        array[uVar1] = (ABS(jac[uVar1]) * dVar4) / dVar3;
        uVar1 = uVar1 + 1;
      } while ((uint)N != uVar1);
    }
    dVar3 = array_max_abs(array,N);
    iVar2 = 1;
    if (gtol < dVar3) {
      if (0 < N) {
        uVar1 = 0;
        do {
          dVar3 = ABS(xf[uVar1]);
          if (dVar3 <= 1.0 / ABS(dx[uVar1])) {
            dVar3 = 1.0 / ABS(dx[uVar1]);
          }
          array[uVar1] = ABS(xf[uVar1] - xc[uVar1]) / dVar3;
          uVar1 = uVar1 + 1;
        } while ((uint)N != uVar1);
      }
      dVar3 = array_max_abs(array,N);
      iVar2 = 0;
      if (dVar3 <= stol) {
        iVar2 = 2;
      }
    }
    free(array);
  }
  return iVar2;
}

Assistant:

int stopcheck_mt(double fx, int N, double *xc, double *xf, double *jac, double *dx, double fsval, double gtol, double stol, int retval) {
	int rcode, i;
	double num, den;
	double stop0;
	double *scheck;

	rcode = 0;

	if (retval == 3) {
		rcode = 4;
		return rcode;
	}
	if (retval == 15) {
		rcode = 15;
		return rcode;
	}
	
	scheck = (double*)malloc(sizeof(double)*N);

	if (fabs(fx) > fabs(fsval)) {
		den = fabs(fx);
	}
	else {
		den = fabs(fsval);
	}
	for (i = 0; i < N; ++i) {
		if (fabs(xf[i]) > 1.0 / fabs(dx[i])) {
			num = fabs(xf[i]);
		}
		else {
			num = 1.0 / fabs(dx[i]);
		}
		scheck[i] = fabs(jac[i]) * num / den;
	}

	stop0 = array_max_abs(scheck, N);

	if (stop0 <= gtol) {
		rcode = 1;
	}
	else {
		for (i = 0; i < N; ++i) {
			if (fabs(xf[i]) > 1.0 / fabs(dx[i])) {
				den = fabs(xf[i]);
			}
			else {
				den = 1.0 / fabs(dx[i]);
			}
			num = fabs(xf[i] - xc[i]);
			scheck[i] = num / den;
		}
		stop0 = array_max_abs(scheck, N);
		if (stop0 <= stol) {
			rcode = 2;
		}
	}

	free(scheck);
	return rcode;
}